

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O2

int __thiscall ncnn::Crop_x86::forward(Crop_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  void *__ptr;
  Allocator *pAVar3;
  bool bVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined8 uVar14;
  int *piVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  size_t sVar25;
  int z;
  long lVar26;
  int *piVar27;
  int iVar28;
  int iVar29;
  int q;
  uint uVar30;
  ulong uVar31;
  int q_1;
  long lVar32;
  Option *pOVar33;
  undefined1 auVar34 [16];
  int _outw;
  Mat m;
  int _outh;
  int _woffset;
  int _outc;
  int _hoffset;
  int _outd;
  Option *local_138;
  size_t local_130;
  Mat m_1;
  int _coffset;
  ulong local_d0;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int _doffset;
  undefined1 local_a8 [16];
  Mat m_2;
  undefined4 uVar8;
  undefined3 uVar10;
  undefined2 uVar12;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined3 uVar17;
  undefined1 uVar18;
  undefined2 uVar19;
  undefined1 uVar20;
  
  m.c = bottom_blob->c;
  uVar23 = (ulong)(uint)m.c;
  auVar34._0_4_ = bottom_blob->dims;
  auVar34._4_4_ = bottom_blob->w;
  uVar1 = bottom_blob->h;
  uVar2 = bottom_blob->d;
  auVar34._8_8_ = CONCAT44(uVar2,uVar1);
  sVar25 = bottom_blob->elemsize;
  iVar22 = bottom_blob->elempack;
  m.elempack = iVar22;
  if (iVar22 != 4) goto LAB_0024b791;
  uVar30 = auVar34._0_4_ - 1;
  local_a8._8_4_ = uVar1;
  local_a8._0_8_ = auVar34._8_8_;
  local_a8._12_4_ = uVar2;
  m.elempack = 1;
  m.w = auVar34._4_4_;
  m.h = uVar1;
  switch(uVar30) {
  case 0:
    m.w = auVar34._4_4_ << 2;
    m.h = 1;
    m.cstep = (size_t)m.w;
    m.dims = m.elempack;
    goto LAB_0024b161;
  case 1:
    m.h = uVar1 << 2;
    m.dims = 2;
    m.cstep = (long)m.h * (long)(int)auVar34._4_4_;
LAB_0024b161:
    m.c = 1;
    m.d = 1;
    m.elempack = 1;
    m.elemsize = 4;
    break;
  case 2:
    m.c = m.c * 4;
    m.elemsize = 4;
    m.dims = 3;
    m.d = 1;
    m.cstep = (long)(int)uVar1 * (long)(int)auVar34._4_4_ + 3U & 0x3ffffffffffffffc;
    break;
  case 3:
    m.c = m.c * 4;
    m.elemsize = 4;
    m.elempack = 1;
    m.dims = 4;
    m.cstep = (long)(int)uVar2 * (long)(int)uVar1 * (long)(int)auVar34._4_4_ + 3U &
              0x3ffffffffffffffc;
    m.d = uVar2;
    break;
  default:
    m.cstep = 0;
    m.elemsize = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.allocator = (Allocator *)0x0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.data = (void *)0x0;
  piVar27 = &_doffset;
  local_138 = opt;
  local_130 = sVar25;
  local_d0 = uVar23;
  local_c8 = auVar34._4_4_;
  iStack_c4 = auVar34._4_4_;
  iStack_c0 = auVar34._4_4_;
  iStack_bc = auVar34._4_4_;
  Crop::resolve_crop_roi
            ((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),&m,&_woffset,
             &_hoffset,piVar27,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar21 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar21 != (int *)0x0) {
    LOCK();
    *piVar21 = *piVar21 + -1;
    UNLOCK();
    if (*piVar21 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  pOVar33 = local_138;
  if (3 < uVar30) goto LAB_0024b776;
  iVar28 = local_a8._0_4_;
  iVar24 = _outc >> 2;
  switch(uVar30) {
  case 0:
    uVar30 = _outw & 3;
    iVar28 = (uint)(uVar30 == 0) * 3 + 1;
    uVar23 = (long)_outw % (long)iVar28;
    if (local_c8 == _outw / iVar28 && uVar30 == 0) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar27 = bottom_blob->refcount;
      if (piVar27 != (int *)0x0) {
        LOCK();
        *piVar27 = *piVar27 + 1;
        UNLOCK();
      }
      piVar27 = top_blob->refcount;
      if (piVar27 == (int *)0x0) goto LAB_0024b8e8;
      LOCK();
      *piVar27 = *piVar27 + -1;
      UNLOCK();
      if (*piVar27 != 0) goto LAB_0024b8e8;
      __ptr = top_blob->data;
      pAVar3 = top_blob->allocator;
joined_r0x0024b421:
      if (pAVar3 == (Allocator *)0x0) {
        free(__ptr);
      }
      else {
        (*pAVar3->_vptr_Allocator[3])(pAVar3,__ptr,uVar23 & 0xffffffff);
      }
LAB_0024b8e8:
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar27 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar27;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar22 = bottom_blob->w;
      iVar28 = bottom_blob->h;
      iVar24 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar22;
      top_blob->h = iVar28;
      top_blob->d = iVar24;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    if (((_outw | _woffset) & 3U) == 0) {
      Mat::create(top_blob,_outw / iVar28,(local_130 >> 2) << (uVar30 == 0) * '\x02',iVar28,
                  local_138->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      crop_pack4_sse(bottom_blob,top_blob,0,_woffset / 4);
      return 0;
    }
    break;
  case 1:
    if (_outw == local_c8) {
      iVar24 = (uint)((_outh & 3U) == 0) * 3 + 1;
      uVar23 = (long)_outh % (long)iVar24;
      if (((_outh & 3U) == 0) && (_outh / iVar24 == iVar28)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar27 = bottom_blob->refcount;
        if (piVar27 != (int *)0x0) {
          LOCK();
          *piVar27 = *piVar27 + 1;
          UNLOCK();
        }
        piVar27 = top_blob->refcount;
        if (piVar27 == (int *)0x0) goto LAB_0024b8e8;
        LOCK();
        *piVar27 = *piVar27 + -1;
        UNLOCK();
        if (*piVar27 != 0) goto LAB_0024b8e8;
        __ptr = top_blob->data;
        pAVar3 = top_blob->allocator;
        goto joined_r0x0024b421;
      }
    }
    if (((_hoffset | _outh) & 3U) == 0) {
      Mat::create(top_blob,_outw,_outh >> 2,(local_130 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                  local_138->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      crop_pack4_sse(bottom_blob,top_blob,_hoffset / 4,_woffset);
      return 0;
    }
    break;
  case 2:
    uVar30 = _outc & 3;
    uVar31 = local_130 >> 2;
    bVar4 = iVar28 == _outh;
    bVar5 = local_c8 == _outw;
    if (bVar4 && bVar5) {
      iVar28 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar23 = (long)_outc % (long)iVar28;
      if (((_outc & 3U) == 0) && (_outc / iVar28 == (int)local_d0)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar27 = bottom_blob->refcount;
        if (piVar27 != (int *)0x0) {
          LOCK();
          *piVar27 = *piVar27 + 1;
          UNLOCK();
        }
        piVar27 = top_blob->refcount;
        if (piVar27 == (int *)0x0) goto LAB_0024b8e8;
        LOCK();
        *piVar27 = *piVar27 + -1;
        UNLOCK();
        if (*piVar27 != 0) goto LAB_0024b8e8;
        __ptr = top_blob->data;
        pAVar3 = top_blob->allocator;
        goto joined_r0x0024b421;
      }
    }
    if (((_coffset | _outc) & 3U) != 0) break;
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.d = bottom_blob->d;
    m.elemsize = bottom_blob->elemsize;
    m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * m.elemsize +
                     (long)bottom_blob->data);
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.cstep = ((long)m.d * m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
              m.elemsize;
    m.dims = bottom_blob->dims;
    m.c = iVar24;
    if (bVar4 && bVar5) {
      Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outh,
                 (void *)CONCAT71((int7)((ulong)piVar27 >> 8),bVar4 && bVar5));
      if (&m_1 != top_blob) {
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + 1;
          UNLOCK();
        }
        piVar27 = top_blob->refcount;
        if (piVar27 != (int *)0x0) {
          LOCK();
          *piVar27 = *piVar27 + -1;
          UNLOCK();
          if (*piVar27 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = m_1.data;
        top_blob->refcount = m_1.refcount;
        top_blob->elemsize = m_1.elemsize;
        top_blob->elempack = m_1.elempack;
        top_blob->allocator = m_1.allocator;
        top_blob->dims = m_1.dims;
        top_blob->w = m_1.w;
        top_blob->h = m_1.h;
        top_blob->d = m_1.d;
        top_blob->c = m_1.c;
        top_blob->cstep = m_1.cstep;
      }
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar22 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
      goto LAB_0024ba17;
    }
    else {
LAB_0024ba17:
      Mat::create(top_blob,_outw,_outh,_outc / 4,uVar31 << (uVar30 == 0) * '\x02',4,
                  pOVar33->blob_allocator);
      iVar22 = -100;
      if ((top_blob->data != (void *)0x0) &&
         (uVar23 = (ulong)top_blob->c, top_blob->cstep * uVar23 != 0)) {
        iVar22 = 0;
        for (lVar32 = 0; lVar32 < (int)uVar23; lVar32 = lVar32 + 1) {
          m_1.data = (void *)(m.cstep * lVar32 * m.elemsize + (long)m.data);
          m_1.refcount = (int *)0x0;
          m_1.elemsize = m.elemsize;
          m_1.elempack = m.elempack;
          m_1.allocator = m.allocator;
          m_1.h = m.h;
          m_1.d = 1;
          m_1.c = m.d;
          m_1.w = m.w;
          m_1.dims = m.dims + -1;
          m_1.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
          if (m.dims == 4) {
            m_1.cstep = (long)m.h * (long)m.w;
          }
          m_2.w = top_blob->w;
          m_2.h = top_blob->h;
          m_2.elemsize = top_blob->elemsize;
          m_2.data = (void *)(top_blob->cstep * lVar32 * m_2.elemsize + (long)top_blob->data);
          m_2.elempack = top_blob->elempack;
          m_2.allocator = top_blob->allocator;
          m_2.refcount = (int *)0x0;
          m_2.c = top_blob->d;
          m_2.d = 1;
          m_2.dims = top_blob->dims + -1;
          m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                      m_2.elemsize;
          if (top_blob->dims == 4) {
            m_2.cstep = (long)m_2.h * (long)m_2.w;
          }
          crop_pack4_sse(&m_1,&m_2,_hoffset,_woffset);
          uVar23 = (ulong)(uint)top_blob->c;
        }
      }
    }
    piVar27 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar27 == (int *)0x0) {
      return iVar22;
    }
    LOCK();
    *piVar27 = *piVar27 + -1;
    UNLOCK();
    if (*piVar27 != 0) {
      return iVar22;
    }
    if (m.allocator != (Allocator *)0x0) {
      (*(m.allocator)->_vptr_Allocator[3])();
      return iVar22;
    }
    goto LAB_0024b86e;
  case 3:
    local_130 = (local_130 >> 2) << ((_outc & 3U) == 0) * '\x02';
    if (uVar2 == _outd && (iVar28 == _outh && local_c8 == _outw)) {
      iVar29 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar23 = (long)_outc % (long)iVar29;
      if (((_outc & 3U) == 0) && (_outc / iVar29 == (int)local_d0)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar27 = bottom_blob->refcount;
        if (piVar27 != (int *)0x0) {
          LOCK();
          *piVar27 = *piVar27 + 1;
          UNLOCK();
        }
        piVar27 = top_blob->refcount;
        if (piVar27 == (int *)0x0) goto LAB_0024b8e8;
        LOCK();
        *piVar27 = *piVar27 + -1;
        UNLOCK();
        if (*piVar27 != 0) goto LAB_0024b8e8;
        __ptr = top_blob->data;
        pAVar3 = top_blob->allocator;
        goto joined_r0x0024b421;
      }
    }
    if (((_coffset | _outc) & 3U) == 0) {
      m.w = bottom_blob->w;
      m.h = bottom_blob->h;
      m.d = bottom_blob->d;
      m.elemsize = bottom_blob->elemsize;
      m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * m.elemsize +
                       (long)bottom_blob->data);
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.cstep = ((long)m.d * m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                m.elemsize;
      m.dims = bottom_blob->dims;
      m.c = iVar24;
      if (uVar2 != _outd || (iVar28 != _outh || local_c8 != _outw)) {
LAB_0024bcef:
        iVar22 = -100;
        Mat::create(top_blob,_outw,_outh,_outd,_outc / 4,local_130,4,pOVar33->blob_allocator);
        if ((top_blob->data != (void *)0x0) &&
           (uVar23 = (ulong)top_blob->c, top_blob->cstep * uVar23 != 0)) {
          for (lVar32 = 0; lVar32 < (int)uVar23; lVar32 = lVar32 + 1) {
            for (lVar26 = 0; lVar26 < _outd; lVar26 = lVar26 + 1) {
              m_1.cstep = (long)m.h * (long)m.w;
              m_1.data = (void *)((long)m.data +
                                 (long)(_doffset + (int)lVar26) * m.elemsize * m_1.cstep +
                                 m.cstep * lVar32 * m.elemsize);
              m_1.refcount = (int *)0x0;
              m_1.elemsize = m.elemsize;
              m_1.elempack = m.elempack;
              m_1.allocator = m.allocator;
              m_2.dims = 2;
              m_1.w = m.w;
              m_1.dims = 2;
              m_1.h = m.h;
              m_1.d = 1;
              m_1.c = 1;
              m_2.w = top_blob->w;
              m_2.h = top_blob->h;
              m_2.elemsize = top_blob->elemsize;
              m_2.elempack = top_blob->elempack;
              m_2.allocator = top_blob->allocator;
              m_2.cstep = (long)m_2.h * (long)m_2.w;
              m_2.data = (void *)((long)top_blob->data +
                                 lVar26 * m_2.elemsize * m_2.cstep +
                                 top_blob->cstep * lVar32 * m_2.elemsize);
              m_2.refcount = (int *)0x0;
              m_2.d = 1;
              m_2.c = 1;
              crop_pack4_sse(&m_1,&m_2,_hoffset,_woffset);
            }
            uVar23 = (ulong)(uint)top_blob->c;
          }
          iVar22 = 0;
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outd,(void *)(ulong)(uint)_outh);
        pOVar33 = local_138;
        iVar22 = -100;
        if (&m_1 != top_blob) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar27 = top_blob->refcount;
          if (piVar27 != (int *)0x0) {
            LOCK();
            *piVar27 = *piVar27 + -1;
            UNLOCK();
            if (*piVar27 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = m_1.data;
          top_blob->refcount = m_1.refcount;
          top_blob->elemsize = m_1.elemsize;
          top_blob->elempack = m_1.elempack;
          top_blob->allocator = m_1.allocator;
          top_blob->dims = m_1.dims;
          top_blob->w = m_1.w;
          top_blob->h = m_1.h;
          top_blob->d = m_1.d;
          top_blob->c = m_1.c;
          top_blob->cstep = m_1.cstep;
        }
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
        goto LAB_0024bcef;
      }
      piVar27 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar27 == (int *)0x0) {
        return iVar22;
      }
      LOCK();
      *piVar27 = *piVar27 + -1;
      UNLOCK();
      if (*piVar27 != 0) {
        return iVar22;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar22;
      }
      goto LAB_0024b86e;
    }
  }
LAB_0024b776:
  sVar25 = bottom_blob->elemsize;
  auVar34._0_4_ = bottom_blob->dims;
  auVar34._4_4_ = bottom_blob->w;
  auVar34._8_4_ = bottom_blob->h;
  auVar34._12_4_ = bottom_blob->d;
  m.c = bottom_blob->c;
  opt = local_138;
  m.elempack = bottom_blob->elempack;
LAB_0024b791:
  m.data = bottom_blob->data;
  piVar27 = bottom_blob->refcount;
  m.refcount._0_4_ = SUB84(piVar27,0);
  m.refcount._4_4_ = (undefined4)((ulong)piVar27 >> 0x20);
  m.allocator = bottom_blob->allocator;
  m.dims = auVar34._0_4_;
  m.w = auVar34._4_4_;
  m.h = auVar34._8_4_;
  m.d = auVar34._12_4_;
  m.cstep = bottom_blob->cstep;
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + 1;
    UNLOCK();
  }
  m.elemsize = sVar25;
  if (iVar22 != 1) {
    m_1.data = *(void **)opt;
    m_1.elemsize = (size_t)opt->workspace_allocator;
    m_1.elempack = opt->openmp_blocktime;
    m_1._28_1_ = opt->use_winograd_convolution;
    m_1._29_1_ = opt->use_sgemm_convolution;
    m_1._30_1_ = opt->use_int8_inference;
    m_1._31_1_ = opt->use_vulkan_compute;
    m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
    m_1._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    uVar6 = opt->flush_denormals;
    uVar7 = opt->use_local_pool_allocator;
    uVar9 = opt->use_shader_local_memory;
    uVar11 = opt->use_cooperative_matrix;
    uVar13 = opt->use_winograd23_convolution;
    uVar12 = CONCAT11(uVar13,uVar11);
    uVar10 = CONCAT21(uVar12,uVar9);
    uVar8 = CONCAT31(uVar10,uVar7);
    uVar14._0_1_ = opt->use_winograd43_convolution;
    uVar14._1_1_ = opt->use_winograd63_convolution;
    uVar14._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar14._3_1_ = opt->use_reserved_7;
    uVar15 = opt->use_reserved_8;
    uVar16 = opt->use_reserved_9;
    uVar18 = opt->use_reserved_10;
    uVar20 = opt->use_reserved_11;
    uVar19 = CONCAT11(uVar20,uVar18);
    uVar17 = CONCAT21(uVar19,uVar16);
    uVar14._4_4_ = CONCAT31(uVar17,uVar15);
    m_1.c = (int)uVar14;
    m_1.refcount = (int *)opt->workspace_allocator;
    m_1.h = uVar6;
    m_1.d = uVar8;
    m_1._60_4_ = uVar14._4_4_;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
  }
  iVar22 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),&m,
                         top_blob,opt);
  piVar27 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + -1;
    UNLOCK();
    if (*piVar27 == 0) {
      if (m.allocator == (Allocator *)0x0) {
LAB_0024b86e:
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar22;
}

Assistant:

int Crop_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}